

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_singleton.c
# Opt level: O1

int configuration_singleton_clear(configuration config)

{
  set psVar1;
  configuration_singleton pcVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar2 = configuration_singleton_ptr;
  psVar1 = configuration_singleton_ptr->scopes;
  pcVar4 = configuration_object_name(config);
  lVar5 = set_get(psVar1,pcVar4);
  if (lVar5 == 0) {
    uVar3 = 0;
  }
  else {
    psVar1 = pcVar2->scopes;
    pcVar4 = configuration_object_name(config);
    lVar5 = set_remove(psVar1,pcVar4);
    uVar3 = (uint)(lVar5 == 0);
  }
  return uVar3;
}

Assistant:

int configuration_singleton_clear(configuration config)
{
	configuration_singleton singleton = configuration_singleton_instance();

	if (set_get(singleton->scopes, (const set_key)configuration_object_name(config)) == NULL)
	{
		return 0;
	}

	if (set_remove(singleton->scopes, (const set_key)configuration_object_name(config)) == NULL)
	{
		return 1;
	}

	return 0;
}